

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicCopyTexImage2DCase::createTexture(BasicCopyTexImage2DCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int height;
  int iVar4;
  int iVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  PixelFormat *pPVar7;
  TextureFormat TVar8;
  char *str;
  Context *pCVar9;
  NotSupportedError *this_01;
  bool local_201;
  int y;
  int x;
  int levelH;
  int levelW;
  int ndx;
  Vector<float,_3> local_1d4;
  Vector<float,_4> local_1c8;
  Vector<float,_4> local_1b8;
  deUint32 local_1a8;
  deUint32 shaderID;
  undefined1 local_198 [8];
  GradientShader shader;
  Random rnd;
  deUint32 tex;
  bool texHasAlpha;
  bool texHasRGB;
  TextureFormat fmt;
  bool targetHasAlpha;
  bool targetHasRGB;
  RenderTarget *renderTarget;
  BasicCopyTexImage2DCase *this_local;
  RenderTarget *this_00;
  
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.m_context
                     );
  iVar2 = (*pRVar6->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
  bVar1 = false;
  if (0 < pPVar7->redBits) {
    pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
    bVar1 = false;
    if (0 < pPVar7->greenBits) {
      pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
      bVar1 = 0 < pPVar7->blueBits;
    }
  }
  pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
  iVar2 = pPVar7->alphaBits;
  TVar8 = mapGLUnsizedInternalFormat(*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4);
  tex = TVar8.order;
  rnd.m_rnd.w._3_1_ = tex != 1;
  local_201 = true;
  if ((tex != 8) && (local_201 = true, tex != 4)) {
    local_201 = tex == 1;
  }
  rnd.m_rnd.w._2_1_ = local_201;
  rnd.m_rnd.z = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&shader.super_ShaderProgram.field_0x154,dVar3);
  FboTestUtil::GradientShader::GradientShader((GradientShader *)local_198,TYPE_FLOAT_VEC4);
  pCVar9 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper);
  local_1a8 = (*pCVar9->_vptr_Context[0x75])(pCVar9,local_198);
  if ((((rnd.m_rnd.w._3_1_ & 1) == 0) || (bVar1)) && (((rnd.m_rnd.w._2_1_ & 1) == 0 || (0 < iVar2)))
     ) {
    pCVar9 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper)
    ;
    dVar3 = local_1a8;
    tcu::Vector<float,_4>::Vector(&local_1b8,0.0);
    tcu::Vector<float,_4>::Vector(&local_1c8,1.0);
    FboTestUtil::GradientShader::setGradient
              ((GradientShader *)local_198,pCVar9,dVar3,&local_1b8,&local_1c8);
    pCVar9 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper)
    ;
    dVar3 = local_1a8;
    tcu::Vector<float,_3>::Vector(&local_1d4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&levelW,1.0,1.0,0.0);
    sglr::drawQuad(pCVar9,dVar3,&local_1d4,(Vec3 *)&levelW);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
               &rnd.m_rnd.z);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               rnd.m_rnd.z);
    for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
      iVar2 = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
      height = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
      iVar4 = sglr::ContextWrapper::getWidth
                        (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper
                        );
      iVar4 = de::Random::getInt((Random *)&shader.super_ShaderProgram.field_0x154,0,iVar4 - iVar2);
      iVar5 = sglr::ContextWrapper::getHeight
                        (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper
                        );
      iVar5 = de::Random::getInt((Random *)&shader.super_ShaderProgram.field_0x154,0,iVar5 - height)
      ;
      sglr::ContextWrapper::glCopyTexImage2D
                (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
                 levelH,*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4,iVar4,iVar5,iVar2,
                 height,0);
    }
    FboTestUtil::GradientShader::~GradientShader((GradientShader *)local_198);
    de::Random::~Random((Random *)&shader.super_ShaderProgram.field_0x154);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x75f);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= mapGLUnsizedInternalFormat(m_internalFormat);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		x			= rnd.getInt(0, getWidth()	- levelW);
			int		y			= rnd.getInt(0, getHeight()	- levelH);

			glCopyTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, x, y, levelW, levelH, 0);
		}
	}